

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkdir.cpp
# Opt level: O3

bool fs_mkdir(string_view path)

{
  string_view path_00;
  int iVar1;
  char *in_RSI;
  size_t in_RDI;
  string_view fname;
  error_code ec;
  error_code local_60;
  basic_string_view<char,_std::char_traits<char>_> local_50;
  path local_40;
  
  local_60._M_value = 0;
  local_50._M_len = in_RDI;
  local_50._M_str = in_RSI;
  local_60._M_cat = (error_category *)std::_V2::system_category();
  std::filesystem::__cxx11::path::
  path<std::basic_string_view<char,std::char_traits<char>>,std::filesystem::__cxx11::path>
            (&local_40,&local_50,auto_format);
  std::filesystem::create_directories(&local_40,&local_60);
  std::filesystem::__cxx11::path::~path(&local_40);
  iVar1 = local_60._M_value;
  if (local_60._M_value != 0) {
    path_00._M_str = local_50._M_str;
    path_00._M_len = local_50._M_len;
    fname._M_str = "fs_mkdir";
    fname._M_len = 8;
    fs_print_error(path_00,fname,&local_60);
  }
  return iVar1 == 0;
}

Assistant:

bool fs_mkdir(std::string_view path)
{
 // make directory with parents

  std::error_code ec;

#ifdef HAVE_CXX_FILESYSTEM
  // https://en.cppreference.com/w/cpp/filesystem/create_directory
  std::filesystem::create_directories(path, ec);
  // we don't use the return value as it indicates if a directory was created or not.
  if (!ec) FFS_LIKELY
    return true;
#else

if(path.empty())
  ec = std::make_error_code(std::errc::invalid_argument);
else {

  std::string buf;

  std::string const p = fs_resolve(path, false, false);
  // ERROR_PATH_NOT_FOUND if relative directory

  const std::vector<std::string> parts = fs_split(p);

  // if first part is root
  if(fs_slash_first(p))
    buf.push_back('/');

  // iterate over parts
  bool ok = false;

  for(const auto& p : parts){
    buf.append(p).push_back('/');
    if(fs_trace) std::cout << "TRACE:mkdir " << buf << "\n";
    // create directory
#ifdef _WIN32
    // https://learn.microsoft.com/en-us/windows/win32/api/fileapi/nf-fileapi-createdirectorya
    ok = CreateDirectoryA(buf.data(), nullptr) != 0;
    if(!ok){
      const auto err = GetLastError();
      // ERROR_PATH_NOT_FOUND if relative directory, thus we absolute() before loop.
      // ERROR_ACCESS_DENIED is OK if it's not the last part
      ok = err == ERROR_ALREADY_EXISTS ||
            (err == ERROR_ACCESS_DENIED && p != parts.back());
    }
#else
  // https://www.man7.org/linux/man-pages/man2/mkdir.2.html
    ok = mkdir(buf.data(), S_IRWXU) == 0 ||
          errno == EEXIST ||
          (errno == EACCES && p != parts.back());
#endif

    if(!ok)  FFS_UNLIKELY
      break;
  } // for

  if(ok)  FFS_LIKELY
    return true;

} // if path.empty()

#endif

  fs_print_error(path, __func__, ec);
  return false;
}